

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutSopBalanceEvalIntInt
              (Vec_Int_t *vCover,int nLeaves,int *pTimes,Vec_Int_t *vAig,int fCompl,int *pArea)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int local_94;
  int k;
  int Res;
  int iRes;
  int pFaninLits [15];
  int *pArea_local;
  int fCompl_local;
  Vec_Int_t *vAig_local;
  int *pTimes_local;
  int nLeaves_local;
  Vec_Int_t *vCover_local;
  
  k = 0;
  if (vAig != (Vec_Int_t *)0x0) {
    for (local_94 = 0; local_94 < nLeaves; local_94 = local_94 + 1) {
      iVar1 = Abc_Var2Lit(local_94,0);
      (&Res)[local_94] = iVar1;
    }
  }
  vCover_local._4_4_ = If_CutSopBalanceEvalInt(vCover,pTimes,&Res,vAig,&k,nLeaves,pArea);
  if (vCover_local._4_4_ == -1) {
    vCover_local._4_4_ = -1;
  }
  else {
    if (vAig != (Vec_Int_t *)0x0) {
      iVar1 = Abc_Lit2Var(k);
      iVar2 = Vec_IntSize(vAig);
      iVar2 = Abc_Lit2Var(iVar2);
      if (iVar1 != nLeaves + iVar2 + -1) {
        __assert_fail("vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xf2,
                      "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                     );
      }
    }
    if (vAig != (Vec_Int_t *)0x0) {
      uVar3 = Abc_LitIsCompl(k);
      Vec_IntPush(vAig,uVar3 ^ fCompl);
      uVar3 = Vec_IntSize(vAig);
      if ((uVar3 & 1) == 0) {
        __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xf5,
                      "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                     );
      }
    }
  }
  return vCover_local._4_4_;
}

Assistant:

int If_CutSopBalanceEvalIntInt( Vec_Int_t * vCover, int nLeaves, int * pTimes, Vec_Int_t * vAig, int fCompl, int * pArea ) 
{
    int pFaninLits[IF_MAX_FUNC_LUTSIZE];
    int iRes = 0, Res, k;
    if ( vAig )
        for ( k = 0; k < nLeaves; k++ )
            pFaninLits[k] = Abc_Var2Lit(k, 0);
    Res = If_CutSopBalanceEvalInt( vCover, pTimes, pFaninLits, vAig, &iRes, nLeaves, pArea );
    if ( Res == -1 )
        return -1;
    assert( vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iRes) ^ fCompl );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}